

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

void helics::setIterationFlags(ActionMessage *command,IterationRequest iterate)

{
  ushort uVar1;
  undefined3 in_register_00000031;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000031,iterate);
  if (iVar2 == 1) {
    uVar1 = 5;
  }
  else if (iVar2 == 7) {
    uVar1 = 0x10;
  }
  else {
    if (iVar2 != 2) {
      return;
    }
    uVar1 = 1;
  }
  command->flags = command->flags | uVar1;
  return;
}

Assistant:

void setIterationFlags(ActionMessage& command, IterationRequest iterate)
{
    switch (iterate) {
        case IterationRequest::FORCE_ITERATION:
            setActionFlag(command, iteration_requested_flag);
            setActionFlag(command, required_flag);
            break;
        case IterationRequest::ITERATE_IF_NEEDED:
            setActionFlag(command, iteration_requested_flag);
            break;
        case IterationRequest::ERROR_CONDITION:
            setActionFlag(command, error_flag);
            break;
        case IterationRequest::NO_ITERATIONS:
        default:
            break;
    }
}